

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

parser_error parse_renderer_combined_renderer(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"name");
    string_free(*(char **)((long)pvVar2 + 8));
    pcVar3 = string_make(pcVar3);
    *(char **)((long)pvVar2 + 8) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_renderer_combined_renderer(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *name;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "name");
	string_free(renderer->comb_rend_nm);
	renderer->comb_rend_nm = string_make(name);
	return PARSE_ERROR_NONE;
}